

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitArraySet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          ArraySet *curr)

{
  Literal *this_00;
  ulong uVar1;
  shared_ptr<wasm::GCData> sVar2;
  undefined1 auStack_158 [8];
  Field field;
  undefined1 local_130 [8];
  Flow ref;
  Flow value;
  Flow index;
  undefined1 local_40 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_130,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&value.breakTo.super_IString.str._M_str,this,curr->index);
    if (index.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->value);
      if (value.breakTo.super_IString.str._M_len == 0) {
        if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
            * -0x5555555555555555 + (long)local_130 != 1) {
LAB_0061e2de:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x43,"const Literal &wasm::Flow::getSingleValue()");
        }
        sVar2 = Literal::getGCData((Literal *)local_40);
        if (local_40 == (undefined1  [8])0x0) {
          (*this->_vptr_ExpressionRunner[2])
                    (this,"null ref",
                     sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
        }
        if (value.breakTo.super_IString.str._M_str +
            ((long)((long)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_0061e2de;
        if (index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_str != (char *)0x2) {
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                        ,0x118,"int32_t wasm::Literal::geti32() const");
        }
        uVar1 = (ulong)(uint)index.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        if (((long)(((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
            (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed <=
            uVar1) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob");
        }
        wasm::Type::getHeapType(&curr->ref->type);
        HeapType::getArray((HeapType *)&index.breakTo.super_IString.str._M_str);
        auStack_158 = (undefined1  [8])index.breakTo.super_IString.str._M_str;
        if (ref.breakTo.super_IString.str._M_str +
            ((long)((long)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_0061e2de;
        Literal::Literal((Literal *)&field.packedType,(Literal *)&value);
        truncateForPacking((Literal *)&index.breakTo.super_IString.str._M_str,this,
                           (Literal *)&field.packedType,(Field *)auStack_158);
        this_00 = (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_start + (uVar1 - 1);
        if (uVar1 == 0) {
          this_00 = (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    fixed._M_elems;
        }
        Literal::operator=(this_00,(Literal *)&index.breakTo.super_IString.str._M_str);
        Literal::~Literal((Literal *)&index.breakTo.super_IString.str._M_str);
        Literal::~Literal((Literal *)&field.packedType);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)ref.breakTo.super_IString.str._M_str;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&value);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)value.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&value);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)value.breakTo.super_IString.str._M_str;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&index);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)index.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&index);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_130;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&ref);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ref.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&ref);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArraySet(ArraySet* curr) {
    NOTE_ENTER("ArraySet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    data->values[i] = truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }